

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O1

void ymf278b_C_w(YMF278BChip *chip,UINT8 reg,UINT8 data)

{
  UINT8 UVar1;
  UINT32 UVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  YMF278BSlot *slot;
  byte bVar9;
  byte *pbVar10;
  
  slot = (YMF278BSlot *)CONCAT71(in_register_00000031,reg);
  uVar8 = (uint)reg;
  if (0xef < (byte)(reg - 8)) {
    if (uVar8 < 6) {
      if (uVar8 == 3) {
        data = data & 0x3f;
      }
      else if (uVar8 == 5) {
        chip->memadr = (uint)data | (uint)chip->regs[3] << 0x10 | (uint)chip->regs[4] << 8;
      }
    }
    else if (uVar8 == 6) {
      if ((chip->regs[2] & 1) != 0) {
        uVar8 = chip->memadr & 0x3fffff;
        if ((chip->ROMSize <= uVar8) &&
           (UVar2 = ymf278b_getRamAddress(chip,uVar8 - chip->ROMSize), UVar2 < chip->RAMSize)) {
          chip->ram[UVar2] = data;
        }
        chip->memadr = chip->memadr + 1;
      }
    }
    else if (uVar8 == 0xf8) {
      chip->fm_l = data & 7;
      chip->fm_r = data >> 3 & 7;
      refresh_opl3_volume(chip);
    }
    else if (uVar8 == 0xf9) {
      chip->pcm_l = data & 7;
      chip->pcm_r = data >> 3 & 7;
    }
    goto LAB_00158ebe;
  }
  uVar7 = (uVar8 - 8) % 0x18;
  switch(uVar8) {
  default:
    uVar3 = (uint)data | chip->slots[uVar7].wave & 0x100;
    chip->slots[uVar7].wave = (UINT16)uVar3;
    if ((uVar3 < 0x180) || (uVar5 = chip->regs[2] >> 2 & 7, (char)uVar5 == '\0')) {
      uVar3 = uVar3 * 0xc;
    }
    else {
      uVar3 = (uVar3 * 0xc + uVar5 * 0x80000) - 0x1200;
    }
    uVar3 = uVar3 & 0x3fffff;
    lVar6 = 0x528;
    if (uVar3 < chip->ROMSize) {
LAB_00158df3:
      pbVar10 = (byte *)((ulong)uVar3 + *(long *)((long)chip->slots + lVar6 + -0x20));
    }
    else {
      uVar3 = ymf278b_getRamAddress(chip,uVar3 - chip->ROMSize);
      if (uVar3 < chip->RAMSize) {
        lVar6 = 0x538;
        goto LAB_00158df3;
      }
      pbVar10 = (byte *)0x0;
    }
    if (pbVar10 == (byte *)0x0) {
      chip->slots[uVar7].bits = 0xff;
      break;
    }
    chip->slots[uVar7].bits = *pbVar10 >> 6;
    *(uint *)&(((YMF278BChip *)(chip->slots + uVar7))->_devData).chipInf =
         (*pbVar10 & 0x3f) << 0x10 |
         (uint)(ushort)(*(ushort *)(pbVar10 + 1) << 8 | *(ushort *)(pbVar10 + 1) >> 8);
    chip->slots[uVar7].loopaddr = *(ushort *)(pbVar10 + 3) << 8 | *(ushort *)(pbVar10 + 3) >> 8;
    chip->slots[uVar7].endaddr = *(ushort *)(pbVar10 + 5) << 8 | *(ushort *)(pbVar10 + 5) >> 8;
    bVar9 = reg + (char)((uVar8 - 8) / 0x18) * -0x18 + 0x78;
    lVar6 = 0;
    do {
      slot = (YMF278BSlot *)(ulong)bVar9;
      ymf278b_C_w(chip,bVar9,pbVar10[lVar6 + 7]);
      bVar9 = bVar9 + 0x18;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 5);
    if (chip->slots[uVar7].keyon == '\0') {
      chip->slots[uVar7].stepptr = 0;
      chip->slots[uVar7].pos = 0;
      break;
    }
    goto LAB_00158ea4;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    *(byte *)((long)&chip->slots[uVar7].wave + 1) = data & 1;
    uVar8 = (uint)(data >> 1) | chip->slots[uVar7].FN & 0x380;
    chip->slots[uVar7].FN = (UINT16)uVar8;
    cVar4 = chip->slots[uVar7].OCT;
    goto joined_r0x00158cb0;
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
    uVar8 = (data & 7) << 7 | chip->slots[uVar7].FN & 0x7f;
    chip->slots[uVar7].FN = (UINT16)uVar8;
    chip->slots[uVar7].PRVB = data >> 3 & 1;
    cVar4 = (char)data >> 4;
    chip->slots[uVar7].OCT = cVar4;
joined_r0x00158cb0:
    uVar3 = 0;
    if (cVar4 != -8) {
      uVar3 = ((uVar8 | 0x400) << (cVar4 + 8U & 0x1f)) >> 3;
    }
    chip->slots[uVar7].step = uVar3;
    break;
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
    bVar9 = 0xff;
    if (data >> 1 != 0x7f) {
      bVar9 = data >> 1;
    }
    chip->slots[uVar7].TLdest = bVar9;
    chip->slots[uVar7].LD = data & 1;
    if ((data & 1) != 0) {
      chip->slots[uVar7].TL = bVar9;
    }
    break;
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
    bVar9 = 8;
    if ((data & 0x10) == 0) {
      bVar9 = data & 0xf;
    }
    chip->slots[uVar7].pan = bVar9;
    if ((data & 0x20) == 0) {
      chip->slots[uVar7].lfo_active = '\x01';
    }
    else {
      chip->slots[uVar7].lfo_active = '\0';
      chip->slots[uVar7].lfo_cnt = 0;
    }
    chip->slots[uVar7].DAMP = data >> 6 & 1;
    UVar1 = chip->slots[uVar7].keyon;
    if (-1 < (char)data) {
      if (UVar1 != '\0') {
        chip->slots[uVar7].keyon = '\0';
        chip->slots[uVar7].state = '\x01';
      }
      break;
    }
    if (UVar1 != '\0') break;
    chip->slots[uVar7].keyon = '\x01';
LAB_00158ea4:
    ymf278b_keyOnHelper((YMF278BChip *)(chip->slots + uVar7),slot);
    break;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
    chip->slots[uVar7].lfo = data >> 3 & 7;
    chip->slots[uVar7].vib = data & 7;
    break;
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
    chip->slots[uVar7].AR = data >> 4;
    chip->slots[uVar7].D1R = data & 0xf;
    break;
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
    chip->slots[uVar7].DL = dl_tab[data >> 4];
    chip->slots[uVar7].D2R = data & 0xf;
    break;
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
    chip->slots[uVar7].RC = data >> 4;
    chip->slots[uVar7].RR = data & 0xf;
    break;
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
    chip->slots[uVar7].AM = data & 7;
  }
LAB_00158ebe:
  chip->regs[reg] = data;
  return;
}

Assistant:

static void ymf278b_C_w(YMF278BChip* chip, UINT8 reg, UINT8 data)
{
	// Handle slot registers specifically
	if (reg >= 0x08 && reg <= 0xF7)
	{
		int snum = (reg - 8) % 24;
		YMF278BSlot* slot = &chip->slots[snum];
		UINT8 wavetblhdr;
		UINT32 base;
		UINT8* buf;
		int i;
		
		switch((reg - 8) / 24)
		{
		case 0:
			slot->wave = (slot->wave & 0x100) | data;
			wavetblhdr = (chip->regs[2] >> 2) & 0x7;
			base = (slot->wave < 384 || ! wavetblhdr) ?
			       (slot->wave * 12) :
			       (wavetblhdr * 0x80000 + ((slot->wave - 384) * 12));
			// TODO What if R#2 bit 0 = 1?
			//      See also getSample()
			buf = ymf278b_getMemPtr(chip, base);
			if (buf == NULL)
			{
				slot->bits = ~0;	// set invalid value to mute the sample
				break;
			}
			
			slot->bits = (buf[0] & 0xC0) >> 6;
			slot->startaddr = buf[2] | (buf[1] << 8) | ((buf[0] & 0x3F) << 16);
			slot->loopaddr = buf[4] | (buf[3] << 8);
			slot->endaddr  = buf[6] | (buf[5] << 8);
			for (i = 7; i < 12; ++i)
			{
				// Verified on real YMF278:
				// After tone loading, if you read these
				// registers, their value actually has changed.
				ymf278b_C_w(chip, 8 + snum + (i - 2) * 24, buf[i]);
			}
			
			if (slot->keyon) {
				ymf278b_keyOnHelper(chip, slot);
			} else {
				slot->stepptr = 0;
				slot->pos = 0;
			}
			break;
		case 1:
			slot->wave = (slot->wave & 0xFF) | ((data & 0x1) << 8);
			slot->FN = (slot->FN & 0x380) | (data >> 1);
			slot->step = calcStep(slot->OCT, slot->FN, 0);
			break;
		case 2:
			slot->FN = (slot->FN & 0x07F) | ((data & 0x07) << 7);
			slot->PRVB = ((data & 0x08) >> 3);
			slot->OCT =  sign_extend_4((data & 0xF0) >> 4);
			slot->step = calcStep(slot->OCT, slot->FN, 0);
			break;
		case 3:
			slot->TLdest = data >> 1;
			if (slot->TLdest == 0x7F)
				slot->TLdest = 0xFF;	// verified on HW via volume interpolation
			slot->LD = data & 0x1;

			if (slot->LD) {
				// directly change volume
				slot->TL = slot->TLdest;
			} else {
				// interpolate volume
			}
			break;
		case 4:
			if (data & 0x10)
			{
				// output to DO1 pin:
				// this pin is not used in moonsound
				// we emulate this by muting the sound
				slot->pan = 8; // both left/right -inf dB
			}
			else
				slot->pan = data & 0x0F;

			if (data & 0x20)
			{
				// LFO reset
				slot->lfo_active = 0;
				slot->lfo_cnt = 0;
			}
			else
			{
				// LFO activate
				slot->lfo_active = 1;
			}

			slot->DAMP = (data & 0x40) >> 6;
			if (data & 0x80)
			{
				if (! slot->keyon)
				{
					slot->keyon = 1;
					ymf278b_keyOnHelper(chip, slot);
				}
			}
			else
			{
				if (slot->keyon)
				{
					slot->keyon = 0;
					slot->state = EG_REL;
				}
			}
			break;
		case 5:
			slot->lfo = (data >> 3) & 0x7;
			slot->vib = data & 0x7;
			break;
		case 6:
			slot->AR  = data >> 4;
			slot->D1R = data & 0xF;
			break;
		case 7:
			slot->DL  = dl_tab[data >> 4];
			slot->D2R = data & 0xF;
			break;
		case 8:
			slot->RC = data >> 4;
			slot->RR = data & 0xF;
			break;
		case 9:
			slot->AM = data & 0x7;
			break;
		}
	}
	else
	{
		// All non-slot registers
		switch (reg)
		{
		case 0x00: // TEST
		case 0x01:
			break;

		case 0x02:
			// wave-table-header / memory-type / memory-access-mode
			// Simply store in regs[2]
			break;

		case 0x03:
			// Verified on real YMF278:
			// * Don't update the 'memadr' variable on writes to
			//   reg 3 and 4. Only store the value in the 'regs'
			//   array for later use.
			// * The upper 2 bits are not used to address the
			//   external memories (so from a HW pov they don't
			//   matter). But if you read back this register, the
			//   upper 2 bits always read as '0' (even if you wrote
			//   '1'). So we mask the bits here already.
			data &= 0x3F;
			break;

		case 0x04:
			// See reg 3.
			break;

		case 0x05:
			// Verified on real YMF278: (see above)
			// Only writes to reg 5 change the (full) 'memadr'.
			chip->memadr = (chip->regs[3] << 16) | (chip->regs[4] << 8) | data;
			break;

		case 0x06:  // memory data
			if (chip->regs[2] & 1) {
				ymf278b_writeMem(chip, chip->memadr, data);
				++chip->memadr; // no need to mask (again) here
			} else {
				// Verified on real YMF278:
				//  - writes are ignored
				//  - memadr is NOT increased
			}
			break;

		case 0xF8:
			chip->fm_l = data & 0x7;
			chip->fm_r = (data >> 3) & 0x7;
			refresh_opl3_volume(chip);
			break;

		case 0xF9:
			chip->pcm_l = data & 0x7;
			chip->pcm_r = (data >> 3) & 0x7;
			break;
		}
	}

	chip->regs[reg] = data;
}